

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateAttributeDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlAttributePtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlElementPtr pxVar3;
  char *msg;
  int iVar4;
  xmlChar *str1;
  xmlEnumerationPtr pxVar5;
  int nbId;
  xmlChar *elemPrefix;
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    return 0;
  }
  if (attr == (xmlAttributePtr)0x0) {
    return 1;
  }
  iVar4 = 1;
  if ((attr->defaultValue != (xmlChar *)0x0) &&
     (iVar1 = xmlValidateAttributeValueInternal(doc,attr->atype,attr->defaultValue), iVar1 == 0)) {
    xmlErrValidNode(ctxt,(xmlNodePtr)attr,XML_DTD_ATTRIBUTE_DEFAULT,
                    "Syntax of default value for attribute %s of %s is not valid\n",attr->name,
                    attr->elem,(xmlChar *)0x0);
    iVar4 = 0;
  }
  if (attr->atype != XML_ATTRIBUTE_ID) goto LAB_00155eb0;
  iVar1 = iVar4;
  if ((attr->def & ~XML_ATTRIBUTE_NONE) != XML_ATTRIBUTE_REQUIRED) {
    xmlErrValidNode(ctxt,(xmlNodePtr)attr,XML_DTD_ID_FIXED,
                    "ID attribute %s of %s is not valid must be #IMPLIED or #REQUIRED\n",attr->name,
                    attr->elem,(xmlChar *)0x0);
    iVar4 = 0;
    iVar1 = 0;
    if (attr->atype != XML_ATTRIBUTE_ID) goto LAB_00155eb0;
  }
  iVar4 = iVar1;
  pxVar2 = xmlSplitQName4(attr->elem,&elemPrefix);
  if (pxVar2 == (xmlChar *)0x0) {
    xmlVErrMemory(ctxt);
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    nbId = 0;
LAB_00155e13:
    if (doc->extSubset != (_xmlDtd *)0x0) {
      pxVar3 = (xmlElementPtr)
               xmlHashLookup2((xmlHashTablePtr)doc->extSubset->elements,pxVar2,elemPrefix);
      if (pxVar3 == (xmlElementPtr)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = xmlScanIDAttributeDecl(ctxt,pxVar3,0);
        if (1 < iVar1) {
          pxVar2 = attr->name;
          str1 = attr->elem;
          msg = "Element %s has %d ID attribute defined in the external subset : %s\n";
          goto LAB_00155e5c;
        }
      }
      if (1 < iVar1 + nbId) {
        xmlErrValidNode(ctxt,(xmlNodePtr)attr,XML_DTD_ID_SUBSET,
                        "Element %s has ID attributes defined in the internal and external subset : %s\n"
                        ,attr->elem,attr->name,(xmlChar *)0x0);
        goto LAB_00155ea0;
      }
    }
  }
  else {
    pxVar3 = (xmlElementPtr)
             xmlHashLookup2((xmlHashTablePtr)doc->intSubset->elements,pxVar2,elemPrefix);
    if (pxVar3 == (xmlElementPtr)0x0) {
      nbId = 0;
      if (doc->intSubset == (_xmlDtd *)0x0) goto LAB_00155e13;
      xmlHashScan3((xmlHashTablePtr)doc->intSubset->attributes,(xmlChar *)0x0,(xmlChar *)0x0,
                   attr->elem,xmlValidateAttributeIdCallback,&nbId);
    }
    else {
      nbId = xmlScanIDAttributeDecl(ctxt,pxVar3,0);
    }
    if (nbId < 2) goto LAB_00155e13;
    pxVar2 = attr->name;
    str1 = attr->elem;
    msg = "Element %s has %d ID attribute defined in the internal subset : %s\n";
    iVar1 = nbId;
LAB_00155e5c:
    xmlErrValidNodeNr(ctxt,(xmlNodePtr)attr,XML_DTD_ID_SUBSET,msg,str1,iVar1,pxVar2);
LAB_00155ea0:
    iVar4 = 0;
  }
  (*xmlFree)(elemPrefix);
LAB_00155eb0:
  if ((attr->defaultValue != (xmlChar *)0x0) &&
     (pxVar5 = attr->tree, pxVar5 != (xmlEnumerationPtr)0x0)) {
    for (; pxVar5 != (xmlEnumerationPtr)0x0; pxVar5 = pxVar5->next) {
      iVar1 = xmlStrEqual(pxVar5->name,attr->defaultValue);
      if (iVar1 != 0) {
        return iVar4;
      }
    }
    xmlErrValidNode(ctxt,(xmlNodePtr)attr,XML_DTD_ATTRIBUTE_VALUE,
                    "Default value \"%s\" for attribute %s of %s is not among the enumerated set\n",
                    attr->defaultValue,attr->name,attr->elem);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
xmlValidateAttributeDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                         xmlAttributePtr attr) {
    int ret = 1;
    int val;
    CHECK_DTD;
    if(attr == NULL) return(1);

    /* Attribute Default Legal */
    /* Enumeration */
    if (attr->defaultValue != NULL) {
	val = xmlValidateAttributeValueInternal(doc, attr->atype,
	                                        attr->defaultValue);
	if (val == 0) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ATTRIBUTE_DEFAULT,
	       "Syntax of default value for attribute %s of %s is not valid\n",
	           attr->name, attr->elem, NULL);
	}
        ret &= val;
    }

    /* ID Attribute Default */
    if ((attr->atype == XML_ATTRIBUTE_ID)&&
        (attr->def != XML_ATTRIBUTE_IMPLIED) &&
	(attr->def != XML_ATTRIBUTE_REQUIRED)) {
	xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ID_FIXED,
          "ID attribute %s of %s is not valid must be #IMPLIED or #REQUIRED\n",
	       attr->name, attr->elem, NULL);
	ret = 0;
    }

    /* One ID per Element Type */
    if (attr->atype == XML_ATTRIBUTE_ID) {
        xmlElementPtr elem = NULL;
        const xmlChar *elemLocalName;
        xmlChar *elemPrefix;
        int nbId;

        elemLocalName = xmlSplitQName4(attr->elem, &elemPrefix);
        if (elemLocalName == NULL) {
            xmlVErrMemory(ctxt);
            return(0);
        }

	/* the trick is that we parse DtD as their own internal subset */
        if (doc->intSubset != NULL)
            elem = xmlHashLookup2(doc->intSubset->elements,
                                  elemLocalName, elemPrefix);
	if (elem != NULL) {
	    nbId = xmlScanIDAttributeDecl(ctxt, elem, 0);
	} else {
	    xmlAttributeTablePtr table;

	    /*
	     * The attribute may be declared in the internal subset and the
	     * element in the external subset.
	     */
	    nbId = 0;
	    if (doc->intSubset != NULL) {
		table = (xmlAttributeTablePtr) doc->intSubset->attributes;
		xmlHashScan3(table, NULL, NULL, attr->elem,
			     xmlValidateAttributeIdCallback, &nbId);
	    }
	}
	if (nbId > 1) {

	    xmlErrValidNodeNr(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
       "Element %s has %d ID attribute defined in the internal subset : %s\n",
		   attr->elem, nbId, attr->name);
            ret = 0;
	} else if (doc->extSubset != NULL) {
	    int extId = 0;
	    elem = xmlHashLookup2(doc->extSubset->elements,
                                  elemLocalName, elemPrefix);
	    if (elem != NULL) {
		extId = xmlScanIDAttributeDecl(ctxt, elem, 0);
	    }
	    if (extId > 1) {
		xmlErrValidNodeNr(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
       "Element %s has %d ID attribute defined in the external subset : %s\n",
		       attr->elem, extId, attr->name);
                ret = 0;
	    } else if (extId + nbId > 1) {
		xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ID_SUBSET,
"Element %s has ID attributes defined in the internal and external subset : %s\n",
		       attr->elem, attr->name, NULL);
                ret = 0;
	    }
	}

        xmlFree(elemPrefix);
    }

    /* Validity Constraint: Enumeration */
    if ((attr->defaultValue != NULL) && (attr->tree != NULL)) {
        xmlEnumerationPtr tree = attr->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, attr->defaultValue)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) attr, XML_DTD_ATTRIBUTE_VALUE,
"Default value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   attr->defaultValue, attr->name, attr->elem);
	    ret = 0;
	}
    }

    return(ret);
}